

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.hpp
# Opt level: O0

xml_node __thiscall
pugi::xml_node::find_node<NULLCPugiXML::predicate_nullc_node>
          (xml_node *this,predicate_nullc_node pred)

{
  bool bVar1;
  unspecified_bool_type p_Var2;
  bool bVar3;
  xml_node local_68;
  xml_node_struct *local_60;
  xml_node local_58;
  xml_node_struct *local_50;
  xml_node local_48;
  xml_node local_40;
  xml_node cur;
  xml_node *this_local;
  undefined1 local_1c [8];
  predicate_nullc_node pred_local;
  
  pred_local.callback.context._0_4_ = pred.callback.id;
  local_1c = (undefined1  [8])pred.callback.context;
  cur._root = (xml_node_struct *)this;
  if (this->_root == (xml_node_struct *)0x0) {
    xml_node((xml_node *)((long)&pred_local.callback.context + 4));
  }
  else {
    local_40 = first_child(this);
    while( true ) {
      bVar3 = false;
      if (local_40._root != (xml_node_struct *)0x0) {
        bVar3 = local_40._root != this->_root;
      }
      if (!bVar3) {
        xml_node((xml_node *)((long)&pred_local.callback.context + 4));
        return (xml_node)(xml_node_struct *)pred_local.callback._4_8_;
      }
      bVar3 = NULLCPugiXML::predicate_nullc_node::operator()
                        ((predicate_nullc_node *)local_1c,&local_40);
      if (bVar3) break;
      local_48 = first_child(&local_40);
      p_Var2 = operator_cast_to_function_pointer(&local_48);
      if (p_Var2 == (unspecified_bool_type)0x0) {
        local_58 = next_sibling(&local_40);
        p_Var2 = operator_cast_to_function_pointer(&local_58);
        if (p_Var2 == (unspecified_bool_type)0x0) {
          while( true ) {
            local_68 = next_sibling(&local_40);
            bVar1 = operator!(&local_68);
            bVar3 = false;
            if (bVar1) {
              bVar3 = local_40._root != this->_root;
            }
            if (!bVar3) break;
            local_40 = parent(&local_40);
          }
          if (local_40._root != this->_root) {
            local_40 = next_sibling(&local_40);
          }
        }
        else {
          local_60 = (xml_node_struct *)next_sibling(&local_40);
          local_40 = (xml_node)local_60;
        }
      }
      else {
        local_50 = (xml_node_struct *)first_child(&local_40);
        local_40 = (xml_node)local_50;
      }
    }
    pred_local.callback._4_8_ = local_40._root;
  }
  return (xml_node)(xml_node_struct *)pred_local.callback._4_8_;
}

Assistant:

xml_node find_node(Predicate pred) const
		{
			if (!_root) return xml_node();

			xml_node cur = first_child();

			while (cur._root && cur._root != _root)
			{
				if (pred(cur)) return cur;

				if (cur.first_child()) cur = cur.first_child();
				else if (cur.next_sibling()) cur = cur.next_sibling();
				else
				{
					while (!cur.next_sibling() && cur._root != _root) cur = cur.parent();

					if (cur._root != _root) cur = cur.next_sibling();
				}
			}

			return xml_node();
		}